

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionExecutionStateMachine.cpp
# Opt level: O3

void __thiscall Js::FunctionExecutionStateMachine::PrintLimits(FunctionExecutionStateMachine *this)

{
  Output::Print(L"limits: %hu.%hu.%hu.%hu.%hu = %hu",
                (ulong)((uint)this->autoProfilingInterpreter0Limit + (uint)this->interpreterLimit),
                (ulong)this->profilingInterpreter0Limit,(ulong)this->autoProfilingInterpreter1Limit,
                (ulong)this->simpleJitLimit,(ulong)this->profilingInterpreter1Limit,
                (uint)this->fullJitThreshold);
  return;
}

Assistant:

void FunctionExecutionStateMachine::PrintLimits() const
    {
        Output::Print(
            _u("limits: %hu.%hu.%hu.%hu.%hu = %hu"),
            interpreterLimit + autoProfilingInterpreter0Limit,
            profilingInterpreter0Limit,
            autoProfilingInterpreter1Limit,
            simpleJitLimit,
            profilingInterpreter1Limit,
            fullJitThreshold);
    }